

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O1

void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  char PrefLo [100];
  char PrefLi [100];
  undefined2 local_108 [56];
  undefined2 local_98 [52];
  
  pVVar8 = pNtk->vPis;
  if (pVVar8->nSize < 1) {
    uVar11 = 0;
  }
  else {
    lVar14 = 0;
    uVar11 = 0;
    do {
      pcVar7 = Nm_ManCreateUniqueName
                         (*(Nm_Man_t **)(*pVVar8->pArray[lVar14] + 0x18),
                          (int)*(long *)((long)pVVar8->pArray[lVar14] + 0x10));
      uVar13 = 0;
      if (*pcVar7 == 'l') {
        uVar13 = 0;
        do {
          lVar4 = uVar13 + 1;
          uVar13 = uVar13 + 1;
        } while (pcVar7[lVar4] == 'l');
      }
      uVar5 = uVar13 & 0xffffffff;
      if ((int)uVar13 < (int)uVar11) {
        uVar5 = uVar11;
      }
      uVar11 = uVar5;
      lVar14 = lVar14 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar14 < pVVar8->nSize);
  }
  iVar12 = (int)uVar11;
  pVVar8 = pNtk->vPos;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      pcVar7 = Nm_ManCreateUniqueName
                         (*(Nm_Man_t **)(*pVVar8->pArray[lVar14] + 0x18),
                          (int)*(long *)((long)pVVar8->pArray[lVar14] + 0x10));
      uVar13 = 0;
      if (*pcVar7 == 'l') {
        uVar13 = 0;
        do {
          lVar4 = uVar13 + 1;
          uVar13 = uVar13 + 1;
        } while (pcVar7[lVar4] == 'l');
      }
      if ((int)uVar11 <= (int)uVar13) {
        uVar11 = uVar13 & 0xffffffff;
      }
      iVar12 = (int)uVar11;
      lVar14 = lVar14 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar14 < pVVar8->nSize);
  }
  if (0x61 < iVar12) {
    __assert_fail("CountMax < 100-2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x22f,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
  }
  if (iVar12 < 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(iVar12 + 1);
    memset(local_108,0x6c,uVar11);
    memset(local_98,0x6c,uVar11);
  }
  *(undefined2 *)((long)local_98 + uVar11) = 0x69;
  *(undefined2 *)((long)local_108 + uVar11) = 0x6f;
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x237,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
  }
  uVar10 = pNtk->nObjCounts[8];
  if (1 < uVar10) {
    uVar9 = 0;
    uVar6 = uVar10 - 1;
    uVar10 = uVar9;
    if (uVar6 != 0) {
      do {
        uVar10 = uVar9 + 1;
        bVar3 = 9 < uVar6;
        uVar9 = uVar10;
        uVar6 = uVar6 / 10;
      } while (bVar3);
    }
  }
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      plVar1 = (long *)pVVar8->pArray[lVar14];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d","l",(ulong)uVar10);
        Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2],
                          *(uint *)((long)plVar1 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0)
        ;
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
        sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d",local_98,(ulong)uVar10);
        Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2],
                          *(uint *)((long)plVar2 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0)
        ;
        plVar1 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        sprintf(Abc_ObjNameDummy::Buffer,"%s%0*d",local_108,(ulong)uVar10);
        Nm_ManStoreIdName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2],
                          *(uint *)((long)plVar1 + 0x14) & 0xf,Abc_ObjNameDummy::Buffer,(char *)0x0)
        ;
      }
      lVar14 = lVar14 + 1;
      pVVar8 = pNtk->vBoxes;
    } while (lVar14 < pVVar8->nSize);
  }
  return;
}

Assistant:

void Abc_NtkAddDummyBoxNames( Abc_Ntk_t * pNtk )
{
    char * pName, PrefLi[100], PrefLo[100];
    Abc_Obj_t * pObj;
    int nDigits, i, k, CountCur, CountMax = 0;
    // if PIs/POs already have nodes with what looks like latch names
    // we need to add different prefix for the new latches
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
//printf( "CountMax = %d\n", CountMax );
    assert( CountMax < 100-2 );
    for ( i = 0; i <= CountMax; i++ )
        PrefLi[i] = PrefLo[i] = 'l';
    PrefLi[i] = 'i';
    PrefLo[i] = 'o';
    PrefLi[i+1] = 0;
    PrefLo[i+1] = 0;
    // create latch names
    assert( !Abc_NtkIsNetlist(pNtk) );
    nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("l", i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanin0(pObj),  Abc_ObjNameDummy(PrefLi, i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjNameDummy(PrefLo, i, nDigits), NULL );
    }
/*
    nDigits = Abc_Base10Log( Abc_NtkBlackboxNum(pNtk) );
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
    {
        pName = Abc_ObjAssignName( pObj, Abc_ObjNameDummy("B", i, nDigits), NULL );
        nDigitsF = Abc_Base10Log( Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("i", k, nDigitsF) );
        nDigitsF = Abc_Base10Log( Abc_ObjFanoutNum(pObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("o", k, nDigitsF) );
    }
*/
}